

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O0

void __thiscall npas4_AllocAll_Test::TestBody(npas4_AllocAll_Test *this)

{
  bool bVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  int64_t memoryDelta;
  uint8_t *megabyte;
  int64_t allocAmmount;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  long local_18;
  int64_t startCurrentProcess;
  npas4_AllocAll_Test *this_local;
  
  startCurrentProcess = (int64_t)this;
  lVar2 = npas4::GetRAMSystemUsedByCurrentProcess();
  local_18 = npas4::GetRAMVirtualUsedByCurrentProcess();
  local_18 = lVar2 + local_18;
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&allocAmmount);
  bVar1 = std::chrono::operator==
                    (&local_20,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&allocAmmount);
  if (bVar1) {
    pvVar3 = operator_new__(0x101000);
    lVar2 = npas4::GetRAMSystemUsedByCurrentProcess();
    lVar4 = npas4::GetRAMVirtualUsedByCurrentProcess();
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((lVar2 + lVar4) - local_18);
    testing::internal::DoubleNearPredFormat
              ((internal *)local_50,"allocAmmount","memoryDelta","4096",1052672.0,
               (double)(long)gtest_ar.message_.ptr_,4096.0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
    if (!bVar1) {
      testing::Message::Message(local_68);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x89,message);
      testing::internal::AssertHelper::operator=(&local_70,local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::Message::~Message(local_68);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
  }
  return;
}

Assistant:

TEST(npas4, AllocAll)
{
	const auto startCurrentProcess = npas4::GetRAMSystemUsedByCurrentProcess() + npas4::GetRAMVirtualUsedByCurrentProcess();

	// This will always be true, but the compiler won't know that, preventing the
	// allocation from happening before we want it to.
	if(std::chrono::system_clock::now() == std::chrono::time_point<std::chrono::system_clock>())
	{
		const int64_t allocAmmount = 1052672;
		volatile uint8_t* megabyte = new uint8_t[allocAmmount];

		// Assume we are not swapping out to disk
		auto memoryDelta = npas4::GetRAMSystemUsedByCurrentProcess()  + npas4::GetRAMVirtualUsedByCurrentProcess() - startCurrentProcess;
		EXPECT_NEAR(allocAmmount, memoryDelta, 4096);
		delete[] megabyte;
	}
}